

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_typedef.cpp
# Opt level: O2

int main(void)

{
  iterator iVar1;
  ostream *poVar2;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  uint local_50;
  key_type local_4c;
  unordered_set<distance,_std::hash<distance>,_std::equal_to<distance>,_std::allocator<distance>_>
  set;
  
  local_50 = 7;
  local_4c.super_strong_typedef<distance,_unsigned_int>.value_ =
       (strong_typedef<distance,_unsigned_int>)(strong_typedef<distance,_unsigned_int>)local_50;
  std::
  _Hashtable<distance,distance,std::allocator<distance>,std::__detail::_Identity,std::equal_to<distance>,std::hash<distance>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<distance_const*>
            ((_Hashtable<distance,distance,std::allocator<distance>,std::__detail::_Identity,std::equal_to<distance>,std::hash<distance>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&set._M_h,&local_50,&local_4c,0,&local_51,&local_52,&local_53);
  iVar1 = std::
          _Hashtable<distance,_distance,_std::allocator<distance>,_std::__detail::_Identity,_std::equal_to<distance>,_std::hash<distance>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&set._M_h,&local_4c);
  poVar2 = operator<<((ostream *)&std::cout,
                      (distance *)
                      ((long)iVar1.super__Node_iterator_base<distance,_false>._M_cur + 8));
  std::operator<<(poVar2,'\n');
  std::
  _Hashtable<distance,_distance,_std::allocator<distance>,_std::__detail::_Identity,_std::equal_to<distance>,_std::hash<distance>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  return 0;
}

Assistant:

int main()
{
    distance d(4);
    //    int      val = d; // error
    //    d += 3;           // error
    d += distance(3); // works

    std::unordered_set<distance> set{d};

    std::cout << *set.find(d) << '\n';
}